

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler_ir2.hpp
# Opt level: O2

string * decompile_data_abi_cxx11_
                   (string *__return_storage_ptr__,DecompiledVar *v,DecompilerIR2 *param_2)

{
  unreachable_exception *this;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (v->type < 4) {
    if (v->global == true) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::to_string(&sStack_38,v->offset);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    else {
      std::__cxx11::to_string(&sStack_38,v->offset >> 2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_38);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  this = (unreachable_exception *)__cxa_allocate_exception(0x10);
  unreachable_exception::unreachable_exception
            (this,
             "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/decompiler_ir2.hpp(228)."
            );
  __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::string decompile_data(const DecompiledVar& v, DecompilerIR2&)
{
    std::string output;

    auto type_cstr = v.type == VarType::Int? "" :
                     v.type == VarType::Float? "" :
                     v.type == VarType::TextLabel? "s" :
                     v.type == VarType::TextLabel16? "v" :
                     Unreachable();

    if(v.global)
    {
        output += type_cstr;
        output.push_back('&');
        output.append(std::to_string(v.offset));
    }
    else
    {
        output.append(std::to_string(v.offset / 4));
        output.push_back('@');
        output += type_cstr;
    }

    return output;
}